

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

tuple<float,_float,_float> anon_unknown.dwarf_2ae89::parseHexColor(string *c)

{
  char *pcVar1;
  ostream *__args;
  long lVar2;
  runtime_error *this;
  ulong in_RSI;
  _Tuple_impl<1UL,_float,_float> extraout_XMM0_Qa;
  _Tuple_impl<1UL,_float,_float> _Var3;
  _Head_base<0UL,_float,_false> in_XMM1_Da;
  tuple<float,_float,_float> tVar4;
  float b;
  float g;
  float r;
  uint ti;
  stringstream t;
  tuple<double,_double,_double> *in_stack_fffffffffffffda8;
  tuple<float,_float,_float> *in_stack_fffffffffffffdb0;
  double *in_stack_fffffffffffffdb8;
  string local_228 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  char *in_stack_fffffffffffffdf8;
  uint local_1cc;
  stringstream local_1c8 [16];
  undefined1 local_1b8 [376];
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  ulong local_10;
  
  local_10 = in_RSI;
  pcVar1 = (char *)std::__cxx11::string::at(in_RSI);
  if (*pcVar1 == '#') {
    std::__cxx11::stringstream::stringstream(local_1c8);
    __args = (ostream *)std::ostream::operator<<(local_1b8,std::hex);
    std::__cxx11::string::substr((ulong)&stack0xfffffffffffffdf8,local_10);
    std::operator<<(__args,(string *)&stack0xfffffffffffffdf8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffffdf8);
    std::istream::operator>>(local_1c8,&local_1cc);
    lVar2 = std::__cxx11::string::length();
    if ((lVar2 != 4) && (lVar2 = std::__cxx11::string::length(), lVar2 != 7)) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
      std::runtime_error::runtime_error(this,local_228);
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    tVar4 = std::make_tuple<float&,float&,float&>
                      ((float *)__args,(float *)in_stack_fffffffffffffdb0,
                       (float *)in_stack_fffffffffffffda8);
    in_XMM1_Da = tVar4.super__Tuple_impl<0UL,_float,_float,_float>.
                 super__Head_base<0UL,_float,_false>._M_head_impl;
    _Var3 = (_Tuple_impl<1UL,_float,_float>)std::__cxx11::stringstream::~stringstream(local_1c8);
  }
  else {
    local_30 = 0x3ff0000000000000;
    local_38 = 0x3ff0000000000000;
    local_40 = 0x3ff0000000000000;
    std::make_tuple<double,double,double>
              (in_stack_fffffffffffffdb8,(double *)in_stack_fffffffffffffdb0,
               (double *)in_stack_fffffffffffffda8);
    std::tuple<float,_float,_float>::tuple<double,_double,_double,_true,_true>
              (in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
    _Var3 = extraout_XMM0_Qa;
  }
  tVar4.super__Tuple_impl<0UL,_float,_float,_float>.super__Head_base<0UL,_float,_false>._M_head_impl
       = in_XMM1_Da._M_head_impl;
  tVar4.super__Tuple_impl<0UL,_float,_float,_float>.super__Tuple_impl<1UL,_float,_float> = _Var3;
  return (tuple<float,_float,_float>)tVar4.super__Tuple_impl<0UL,_float,_float,_float>;
}

Assistant:

std::tuple<float, float, float> parseHexColor(const std::string& c) {
  if (c.at(0) != '#') {
    return std::make_tuple(1.0, 1.0, 1.0);
  }

  std::stringstream t;
  unsigned int ti;
  float r, g, b;

  t << std::hex << c.substr(1);
  t >> ti;

  if (c.length() == 4) {
    // #xxx style
    r = ((ti & 0xF00) >> 8) / 15.0;
    g = ((ti & 0xF0) >> 4) / 15.0;
    b = (ti & 0xF) / 15.0;
  } else if (c.length() == 7) {
    // #xxxxxx style
    r = ((ti & 0xFF0000) >> 16) / 255.0;
    g = ((ti & 0xFF00) >> 8) / 255.0;
    b = (ti & 0xFF) / 255.0;
  } else {
    throw std::runtime_error("Invalid hex color code: " + c);
  }

  return std::make_tuple(r, g, b);
}